

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.h
# Opt level: O1

bool __thiscall
bidirectional::BiDirectional::checkVertexVisited
          (BiDirectional *this,Directions *direction,int *vertex_idx)

{
  _Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_> _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  _Var1.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl =
       (&this->fwd_search_ptr_)[*direction != FWD]._M_t.
       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
       super__Head_base<0UL,_bidirectional::Search_*,_false>;
  lVar4 = *(long *)((long)_Var1.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl +
                   0x30);
  lVar2 = (long)_Var1.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl + 0x28;
  lVar3 = lVar2;
  if (lVar4 != 0) {
    do {
      if (*vertex_idx <= *(int *)(lVar4 + 0x20)) {
        lVar3 = lVar4;
      }
      lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < *vertex_idx) * 8);
    } while (lVar4 != 0);
  }
  lVar4 = lVar2;
  if ((lVar3 != lVar2) && (lVar4 = lVar3, *vertex_idx < *(int *)(lVar3 + 0x20))) {
    lVar4 = lVar2;
  }
  return lVar4 != lVar2;
}

Assistant:

Search* getSearchPtr(Directions direction) {
    if (direction == FWD)
      return fwd_search_ptr_.get();
    return bwd_search_ptr_.get();
  }